

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

char * __thiscall llvm::DWARFDie::getName(DWARFDie *this,DINameKind Kind)

{
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 aVar1;
  Optional<const_char_*> OVar2;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  ArrayRef<llvm::dwarf::Attribute> Attrs_00;
  Optional<llvm::DWARFFormValue> local_58;
  Attribute local_1c [2];
  
  aVar1.value = (char *)0x0;
  if (((Kind != None) && (this->U != (DWARFUnit *)0x0)) && (this->Die != (DWARFDebugInfoEntry *)0x0)
     ) {
    if (Kind == LinkageName) {
      local_1c[0] = DW_AT_MIPS_linkage_name;
      local_1c[1] = DW_AT_linkage_name;
      Attrs.Length = 2;
      Attrs.Data = local_1c;
      findRecursively(&local_58,this,Attrs);
      if (local_58.Storage.hasVal != false) {
        OVar2 = DWARFFormValue::getAsCString((DWARFFormValue *)&local_58);
        if ((OVar2.Storage.hasVal & OVar2.Storage.field_0.value != (char *)0x0) != 0) {
          return OVar2.Storage.field_0.value;
        }
      }
    }
    local_1c[0] = 3;
    Attrs_00.Length = 1;
    Attrs_00.Data = local_1c;
    findRecursively(&local_58,this,Attrs_00);
    if (local_58.Storage.hasVal == true) {
      OVar2 = DWARFFormValue::getAsCString((DWARFFormValue *)&local_58);
      aVar1.value = (char *)0x0;
      if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        aVar1 = OVar2.Storage.field_0;
      }
    }
    else {
      aVar1.value = (char *)0x0;
    }
  }
  return aVar1.value;
}

Assistant:

const char *DWARFDie::getName(DINameKind Kind) const {
  if (!isValid() || Kind == DINameKind::None)
    return nullptr;
  // Try to get mangled name only if it was asked for.
  if (Kind == DINameKind::LinkageName) {
    if (auto Name = dwarf::toString(
            findRecursively({DW_AT_MIPS_linkage_name, DW_AT_linkage_name}),
            nullptr))
      return Name;
  }
  if (auto Name = dwarf::toString(findRecursively(DW_AT_name), nullptr))
    return Name;
  return nullptr;
}